

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CircularBuffer.h
# Opt level: O0

void __thiscall
axl::sl::CircularBufferBase<char>::copyTo
          (CircularBufferBase<char> *this,size_t i,char *p,size_t length)

{
  SimpleArrayDetails<char> *this_00;
  EVP_PKEY_CTX *pEVar1;
  size_t sVar2;
  EVP_PKEY_CTX *in_RCX;
  EVP_PKEY_CTX *in_RDX;
  long in_RSI;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RDI;
  size_t tail;
  char *buffer;
  
  this_00 = (SimpleArrayDetails<char> *)
            Array<char,_axl::sl::ArrayDetails<char>_>::p
                      ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_RDI);
  pEVar1 = (EVP_PKEY_CTX *)ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  if (pEVar1 < in_RCX + in_RSI) {
    sVar2 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
    pEVar1 = (EVP_PKEY_CTX *)(sVar2 - in_RSI);
    SimpleArrayDetails<char>::copy(this_00 + in_RSI,in_RDX,pEVar1);
    SimpleArrayDetails<char>::copy(this_00,in_RDX + (long)pEVar1,in_RCX + -(long)pEVar1);
  }
  else {
    SimpleArrayDetails<char>::copy(this_00 + in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

void
	copyTo(
		size_t i,
		const C* p,
		size_t length
	) {
		C* buffer = m_buffer.p();
		if (i + length <= m_buffer.getCount())
			sl::ArrayDetails<C>::copy(buffer + i, p, length);
		else {
			size_t tail = m_buffer.getCount() - i;
			ASSERT(tail);

			sl::ArrayDetails<C>::copy(buffer + i, p, tail);
			sl::ArrayDetails<C>::copy(buffer, p + tail, length - tail);
		}
	}